

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itersolv.c
# Opt level: O2

Vector * JacobiIter(QMatrix *A,Vector *x,Vector *b,int MaxIter,PrecondProcType Dummy,double Omega)

{
  LASErrIdType LVar1;
  Boolean BVar2;
  size_t Dim;
  Vector *pVVar3;
  QMatrix *Q;
  int Iter;
  double bNorm;
  double dVar4;
  undefined1 auVar5 [16];
  Vector r;
  
  Q_Lock(A);
  V_Lock(x);
  V_Lock(b);
  Dim = Q_GetDim(A);
  Iter = 0;
  V_Constr(&r,"r",Dim,Normal,True);
  LVar1 = LASResult();
  if (LVar1 == LASOK) {
    bNorm = l2Norm_V(b);
    dVar4 = l1Norm_V(x);
    auVar5._8_4_ = (int)(Dim >> 0x20);
    auVar5._0_8_ = Dim;
    auVar5._12_4_ = 0x45300000;
    pVVar3 = b;
    if (ABS(dVar4 / ((auVar5._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)Dim) - 4503599627370496.0))) <
        2.2250738585072014e-307) goto LAB_00105d4c;
    BVar2 = Q_KerDefined(A);
    Iter = 0;
    if (BVar2 != False) {
      OrthoRightKer_VQ(x,A);
      Iter = 0;
    }
    do {
      pVVar3 = Mul_QV(A,x);
      pVVar3 = Sub_VV(b,pVVar3);
LAB_00105d4c:
      Asgn_VV(&r,pVVar3);
      do {
        dVar4 = l2Norm_V(&r);
        BVar2 = RTCResult(Iter,dVar4,bNorm,JacobiIterId);
        if ((BVar2 != False) || (MaxIter <= Iter)) goto LAB_00105c91;
        Q = Diag_Q(A);
        pVVar3 = MulInv_QV(Q,&r);
        pVVar3 = Mul_SV(Omega,pVVar3);
        AddAsgn_VV(x,pVVar3);
        BVar2 = Q_KerDefined(A);
        if (BVar2 != False) {
          OrthoRightKer_VQ(x,A);
        }
        Iter = Iter + 1;
      } while (MaxIter <= Iter);
    } while( true );
  }
LAB_00105c91:
  V_Destr(&r);
  Q_Unlock(A);
  V_Unlock(x);
  V_Unlock(b);
  return x;
}

Assistant:

Vector *JacobiIter(QMatrix *A, Vector *x, Vector *b, int MaxIter,
            PrecondProcType Dummy, double Omega)
{
    (void) Dummy;

    int Iter;
    double bNorm;
    size_t Dim;
    Vector r;

    Q_Lock(A);
    V_Lock(x);
    V_Lock(b);
    
    Dim = Q_GetDim(A);
    V_Constr(&r, "r", Dim, Normal, True);

    if (LASResult() == LASOK) {
        bNorm = l2Norm_V(b);

        Iter = 0;
        /* r = b - A * x(i) */
        if (!IsZero(l1Norm_V(x) / Dim)) {
            if (Q_KerDefined(A))
	       OrthoRightKer_VQ(x, A);
            Asgn_VV(&r, Sub_VV(b, Mul_QV(A, x)));
        } else {
            Asgn_VV(&r, b);
	}
        while (!RTCResult(Iter, l2Norm_V(&r), bNorm, JacobiIterId)
            && Iter < MaxIter) {
            Iter++;
            /* x(i+1) = x(i) + Omega * D^(-1) * r */
            AddAsgn_VV(x, Mul_SV(Omega, MulInv_QV(Diag_Q(A), &r)));
            if (Q_KerDefined(A))
	       OrthoRightKer_VQ(x, A);
            /* r = b - A * x(i) */
            if (Iter < MaxIter)
                Asgn_VV(&r, Sub_VV(b, Mul_QV(A, x)));
        }
    }

    V_Destr(&r);

    Q_Unlock(A);
    V_Unlock(x);
    V_Unlock(b);

    return(x);
}